

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O1

void des3_cbc3_setiv(ssh_cipher *ciph,void *viv)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  
  uVar1 = *viv;
  uVar2 = *(uint *)((long)viv + 4);
  uVar1 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar4 = (uVar1 >> 4 ^ uVar2) & 0xf0f0f0f;
  uVar1 = uVar4 << 4 ^ uVar1;
  uVar4 = uVar4 ^ uVar2;
  uVar2 = uVar4 & 0xffff ^ uVar1 >> 0x10;
  uVar1 = uVar2 << 0x10 ^ uVar1;
  uVar2 = uVar2 ^ uVar4;
  uVar4 = (uVar2 >> 2 ^ uVar1) & 0x33333333;
  uVar2 = uVar4 * 4 ^ uVar2;
  uVar4 = uVar4 ^ uVar1;
  uVar1 = (uVar2 >> 8 ^ uVar4) & 0xff00ff;
  uVar2 = uVar1 << 8 ^ uVar2;
  uVar1 = uVar1 ^ uVar4;
  uVar4 = (uVar1 >> 1 ^ uVar2) & 0x55555555;
  uVar1 = uVar4 * 2 ^ uVar1;
  uVar4 = uVar4 ^ uVar2;
  lVar3 = -0x18;
  do {
    *(ulong *)((long)&ciph->vt + lVar3) =
         CONCAT44(uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f,
                  uVar1 >> 1 | (uint)((uVar1 & 1) != 0) << 0x1f);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0);
  return;
}

Assistant:

static void des3_cbc3_setiv(ssh_cipher *ciph, const void *viv)
{
    struct des3_cbc3_ctx *ctx = container_of(ciph, struct des3_cbc3_ctx, ciph);

    /*
     * In principle, we ought to provide an interface for the user to
     * input 24 instead of 8 bytes of IV. But that would make this an
     * ugly exception to the otherwise universal rule that IV size =
     * cipher block size, and there's really no need to violate that
     * rule given that this is a historical one-off oddity and SSH-1
     * always initialises all three IVs to zero anyway. So we fudge it
     * by just setting all the IVs to the same value.
     */

    LR iv = des_load_lr(viv);

    /* But we store the IVs in permuted form, so that we can handle
     * all three CBC layers without having to do IP/FP in between. */
    iv = des_IP(iv);
    for (size_t i = 0; i < 3; i++)
        ctx->iv[i] = iv;
}